

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

Variable * __thiscall
soul::PoolAllocator::
allocate<soul::heart::Variable,soul::CodeLocation,soul::Type&,soul::Identifier&,soul::heart::Variable::Role>
          (PoolAllocator *this,CodeLocation *args,Type *args_1,Identifier *args_2,Role *args_3)

{
  PoolItem *pPVar1;
  CodeLocation local_58;
  Type local_40;
  
  pPVar1 = allocateSpaceForObject(this,0x88);
  local_58.sourceCode.object = (args->sourceCode).object;
  local_58.location.data = (args->location).data;
  (args->sourceCode).object = (SourceCodeText *)0x0;
  Type::Type(&local_40,args_1);
  heart::Variable::Variable
            ((Variable *)&pPVar1->item,&local_58,&local_40,(Identifier)args_2->name,*args_3);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_40.structure);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_58.sourceCode);
  pPVar1->destructor =
       allocate<soul::heart::Variable,_soul::CodeLocation,_soul::Type_&,_soul::Identifier_&,_soul::heart::Variable::Role>
       ::anon_class_1_0_00000001::__invoke;
  return (Variable *)&pPVar1->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }